

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddWindow.c
# Opt level: O0

int ddWindow4(DdManager *table,int low,int high)

{
  int iVar1;
  int local_24;
  int res;
  int w;
  int high_local;
  int low_local;
  DdManager *table_local;
  
  local_24 = low;
  if (high - low < 3) {
    table_local._4_4_ = ddWindow3(table,low,high);
  }
  else {
    for (; local_24 + 2 < high; local_24 = local_24 + 1) {
      iVar1 = ddPermuteWindow4(table,local_24);
      if (iVar1 == 0) {
        return 0;
      }
    }
    table_local._4_4_ = 1;
  }
  return table_local._4_4_;
}

Assistant:

static int
ddWindow4(
  DdManager * table,
  int  low,
  int  high)
{

    int w;
    int res;

#ifdef DD_DEBUG
    assert(low >= 0 && high < table->size);
#endif

    if (high-low < 3) return(ddWindow3(table,low,high));

    for (w = low; w+2 < high; w++) {
        res = ddPermuteWindow4(table,w);
        if (res == 0) return(0);
#ifdef DD_STATS
        if (res == ABCD) {
            (void) fprintf(table->out,"=");
        } else {
            (void) fprintf(table->out,"-");
        }
        fflush(table->out);
#endif
    }

    return(1);

}